

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O0

double __thiscall spatial_region::get_max_w(spatial_region *this,double left,double right)

{
  celle ***pppcVar1;
  celle *pcVar2;
  cellb ***pppcVar3;
  cellb *pcVar4;
  field3d<cellb> *in_RDI;
  double in_XMM0_Qa;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double in_XMM1_Qa;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double w;
  cellb *b;
  celle *e;
  int k;
  int j;
  int i;
  double max_w;
  int in_stack_ffffffffffffffac;
  int local_2c;
  int local_28;
  int local_24;
  double local_20;
  
  local_20 = 0.0;
  local_24 = (int)in_XMM0_Qa;
  while( true ) {
    if (in_XMM1_Qa <= (double)local_24) break;
    for (local_28 = 0; local_28 < in_RDI->ny; local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < in_RDI->nz; local_2c = local_2c + 1) {
        pppcVar1 = field3d<celle>::operator[]((field3d<celle> *)in_RDI,in_stack_ffffffffffffffac);
        pcVar2 = (*pppcVar1)[local_28] + local_2c;
        pppcVar3 = field3d<cellb>::operator[](in_RDI,in_stack_ffffffffffffffac);
        pcVar4 = (*pppcVar3)[local_28] + local_2c;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = pcVar2->ex;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = pcVar2->ex;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = pcVar2->ey * pcVar2->ey;
        auVar5 = vfmadd213sd_fma(auVar10,auVar5,auVar13);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = pcVar2->ez;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = pcVar2->ez;
        auVar5 = vfmadd213sd_fma(auVar14,auVar6,auVar5);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = pcVar4->bx;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = pcVar4->bx;
        auVar5 = vfmadd213sd_fma(auVar11,auVar7,auVar5);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = pcVar4->by;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = pcVar4->by;
        auVar5 = vfmadd213sd_fma(auVar15,auVar8,auVar5);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = pcVar4->bz;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = pcVar4->bz;
        auVar5 = vfmadd213sd_fma(auVar9,auVar12,auVar5);
        if (local_20 < auVar5._0_8_) {
          local_20 = auVar5._0_8_;
        }
      }
    }
    local_24 = local_24 + 1;
  }
  return local_20;
}

Assistant:

double spatial_region::get_max_w(double left, double right) {
    double max_w = 0.0;
    for (int i = left; i < right; i++) {
        for (int j = 0; j < ny; j++) {
            for (int k = 0; k < nz; k++) {
                celle & e = ce[i][j][k];
                cellb & b = cb[i][j][k];
                // fields are not interpolated to the same point, but should be fine for estimation
                double w = e.ex * e.ex + e.ey * e.ey + e.ez * e.ez + b.bx * b.bx + b.by * b.by + b.bz * b.bz;
                if (w > max_w) {
                    max_w = w;
                }
            }
        }
    }
    return max_w;
}